

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestTailCallerImpl::foo(TestTailCallerImpl *this,FooContext context)

{
  RequestHook **__return_storage_ptr__;
  int32_t value;
  PromiseNode *extraout_RDX;
  Promise<void> PVar1;
  ArrayPtr<const_char> local_d8 [2];
  Maybe<capnp::MessageSize> local_b8;
  Client local_a0;
  undefined1 local_88 [8];
  Request<capnproto_test::capnp::test::TestTailCallee::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  tailRequest;
  Reader params;
  TestTailCallerImpl *this_local;
  FooContext context_local;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  __return_storage_ptr__ = &tailRequest.hook.ptr;
  context_local.hook = (CallContextHook *)this;
  CallContext<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  ::getParams((Reader *)__return_storage_ptr__,
              (CallContext<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
               *)&this_local);
  capnproto_test::capnp::test::TestTailCaller::FooParams::Reader::getCallee
            (&local_a0,(Reader *)__return_storage_ptr__);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_b8,(void *)0x0);
  capnproto_test::capnp::test::TestTailCallee::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestTailCallee::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
              *)local_88,&local_a0,&local_b8);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_b8);
  capnproto_test::capnp::test::TestTailCallee::Client::~Client(&local_a0);
  value = capnproto_test::capnp::test::TestTailCaller::FooParams::Reader::getI
                    ((Reader *)&tailRequest.hook.ptr);
  capnproto_test::capnp::test::TestTailCallee::FooParams::Builder::setI((Builder *)local_88,value);
  Text::Reader::Reader((Reader *)local_d8,"from TestTailCaller");
  capnproto_test::capnp::test::TestTailCallee::FooParams::Builder::setT
            ((Builder *)local_88,(Reader)local_d8[0]);
  kj::
  mv<capnp::Request<capnproto_test::capnp::test::TestTailCallee::FooParams,capnproto_test::capnp::test::TestTailCallee::TailResult>>
            ((Request<capnproto_test::capnp::test::TestTailCallee::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
              *)local_88);
  CallContext<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  ::tailCall<capnproto_test::capnp::test::TestTailCallee::FooParams>
            ((CallContext<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
              *)this,(Request<capnproto_test::capnp::test::TestTailCallee::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
                      *)&this_local);
  Request<capnproto_test::capnp::test::TestTailCallee::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  ::~Request((Request<capnproto_test::capnp::test::TestTailCallee::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
              *)local_88);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestTailCallerImpl::foo(FooContext context) {
  ++callCount;

  auto params = context.getParams();
  auto tailRequest = params.getCallee().fooRequest();
  tailRequest.setI(params.getI());
  tailRequest.setT("from TestTailCaller");
  return context.tailCall(kj::mv(tailRequest));
}